

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do.c
# Opt level: O0

int dodrop(obj *obj)

{
  int iVar1;
  int i;
  int result;
  obj *ostack;
  obj *obj_local;
  
  _i = (obj *)0x0;
  iVar1 = 2;
  if (invent != (obj *)0x0) {
    iVar1 = 0;
  }
  ostack = obj;
  if (u.ushops[0] != '\0') {
    sellobj_state(1);
  }
  if (ostack == (obj *)0x0) {
    ostack = getobj("\x13\x14" + iVar1,"drop",(obj **)&i);
  }
  iVar1 = drop(ostack,_i);
  if (u.ushops[0] != '\0') {
    sellobj_state(0);
  }
  reset_occupations();
  return iVar1;
}

Assistant:

int dodrop(struct obj *obj)
{
	struct obj *ostack = NULL;
	int result, i = (invent) ? 0 : (SIZE(drop_types) - 1);

	if (*u.ushops) sellobj_state(SELL_DELIBERATE);
	if (!obj) obj = getobj(&drop_types[i], "drop", &ostack);
	result = drop(obj, ostack);
	if (*u.ushops) sellobj_state(SELL_NORMAL);
	reset_occupations();

	return result;
}